

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usdc-reader.cc
# Opt level: O3

bool __thiscall
tinyusdz::usdc::USDCReader::Impl::ReconstructPrimSpecNode
          (Impl *this,int parent,int current,int level,bool is_parent_variant,
          PathIndexToSpecIndexMap *psmap,Layer *layer,optional<tinyusdz::PrimSpec> *primOut)

{
  Index *__x;
  _Rb_tree_header *p_Var1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  uint uVar3;
  pointer pNVar4;
  pointer pSVar5;
  iterator iVar6;
  undefined1 *puVar7;
  Impl *pIVar8;
  fmt fVar9;
  char cVar10;
  char cVar11;
  bool bVar12;
  int iVar13;
  const_iterator cVar14;
  size_type sVar15;
  mapped_type *fvs;
  ostream *poVar16;
  undefined8 *puVar17;
  long *plVar18;
  size_type sVar19;
  mapped_type *this_00;
  size_type sVar20;
  mapped_type *this_01;
  vector<int,std::allocator<int>> *pvVar21;
  ulong uVar22;
  ulong uVar23;
  uint *args;
  long *plVar24;
  ulong *puVar25;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar26;
  Property *this_02;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_00;
  uint uVar27;
  SpecType ty;
  _Base_ptr p_Var28;
  long lVar29;
  PathIndexToSpecIndexMap *psmap_00;
  char *pcVar30;
  char *pcVar31;
  undefined8 uVar32;
  _Base_ptr p_Var33;
  Path *pPVar34;
  undefined8 uVar35;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar36;
  optional<tinyusdz::Specifier> specifier;
  PropertyMap props;
  string __str;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  variantPair;
  string prim_name;
  string pTyName;
  string variantPrimName;
  string variantSetName;
  Path elemPath;
  ostringstream ss_e_14;
  optional<tinyusdz::Specifier> specifier_1;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> primChildren;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> properties;
  ostringstream ss_e;
  PrimMeta primMeta;
  Index local_10c0;
  int local_10bc;
  Impl *local_10b8;
  optional<tinyusdz::Specifier> local_10b0;
  undefined1 local_10a8 [24];
  undefined1 local_1090 [16];
  size_t local_1080;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1078;
  PathIndexToSpecIndexMap *local_1050;
  array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
  local_1048;
  string local_1008;
  string local_fe8;
  string local_fc8;
  undefined1 local_fa8 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_f88;
  long local_f78 [2];
  Path local_f68;
  undefined1 local_e90 [40];
  undefined1 local_e68 [40];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e40 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e20 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e00 [2];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_de0 [12];
  undefined1 local_d18 [4];
  storage_t<tinyusdz::Specifier> sStack_d14;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d08;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_cf8;
  vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> local_cd8;
  undefined1 local_cc0 [8];
  undefined1 local_cb8 [32];
  string local_c98 [56];
  undefined1 local_c60 [112];
  undefined1 local_bf0 [1504];
  undefined1 local_610 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_600 [93];
  
  pNVar4 = (this->_nodes).
           super__Vector_base<tinyusdz::crate::CrateReader::Node,_std::allocator<tinyusdz::crate::CrateReader::Node>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_10c0.value = current;
  local_10bc = parent;
  local_cc0._0_4_ = current;
  cVar14 = ::std::
           _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::find(&psmap->_M_h,(key_type_conflict1 *)local_cc0);
  if (cVar14.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur ==
      (__node_type *)0x0) {
    return true;
  }
  local_1050 = psmap;
  local_cc0._0_4_ = current;
  cVar14 = ::std::
           _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
           ::find(&psmap->_M_h,(key_type_conflict1 *)local_cc0);
  if (cVar14.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur ==
      (__node_type *)0x0) {
    ::std::__throw_out_of_range("_Map_base::at");
  }
  uVar3 = *(uint *)((long)cVar14.
                          super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                          ._M_cur + 0xc);
  uVar23 = (ulong)uVar3;
  pSVar5 = (this->_specs).
           super__Vector_base<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_>._M_impl
           .super__Vector_impl_data._M_start;
  uVar22 = ((long)(this->_specs).
                  super__Vector_base<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)pSVar5 >> 2) *
           -0x5555555555555555;
  if (uVar22 < uVar23 || uVar22 - uVar23 == 0) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_cc0);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_cc0,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
               ,0x55);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_cc0,"ReconstructPrimSpecNode",0x17);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"():",3);
    poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)local_cc0,0xafd);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
    cVar11 = '\x01';
    if (9 < uVar3) {
      uVar27 = uVar3;
      cVar10 = '\x04';
      do {
        cVar11 = cVar10;
        if (uVar27 < 100) {
          cVar11 = cVar11 + -2;
          goto LAB_0018899f;
        }
        if (uVar27 < 1000) {
          cVar11 = cVar11 + -1;
          goto LAB_0018899f;
        }
        if (uVar27 < 10000) goto LAB_0018899f;
        bVar12 = 99999 < uVar27;
        uVar27 = uVar27 / 10000;
        cVar10 = cVar11 + '\x04';
      } while (bVar12);
      cVar11 = cVar11 + '\x01';
    }
LAB_0018899f:
    local_10a8._0_8_ = local_10a8 + 0x10;
    ::std::__cxx11::string::_M_construct((ulong)local_10a8,cVar11);
    ::std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)local_10a8._0_8_,local_10a8._8_4_,uVar3);
    plVar18 = (long *)::std::__cxx11::string::replace((ulong)local_10a8,0,(char *)0x0,0x39ac7e);
    paVar26 = &local_1048._M_elems[0].field_2;
    plVar24 = plVar18 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar18 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)plVar24) {
      local_1048._M_elems[0].field_2._M_allocated_capacity = *plVar24;
      local_1048._M_elems[0].field_2._8_8_ = plVar18[3];
      local_1048._M_elems[0]._M_dataplus._M_p = (pointer)paVar26;
    }
    else {
      local_1048._M_elems[0].field_2._M_allocated_capacity = *plVar24;
      local_1048._M_elems[0]._M_dataplus._M_p = (pointer)*plVar18;
    }
    local_1048._M_elems[0]._M_string_length = plVar18[1];
    *plVar18 = (long)plVar24;
    plVar18[1] = 0;
    *(undefined1 *)(plVar18 + 2) = 0;
    plVar18 = (long *)::std::__cxx11::string::append((char *)&local_1048);
    paVar2 = &local_f68._prim_part.field_2;
    plVar24 = plVar18 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar18 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)plVar24) {
      local_f68._prim_part.field_2._M_allocated_capacity = *plVar24;
      local_f68._prim_part.field_2._8_8_ = plVar18[3];
      local_f68._prim_part._M_dataplus._M_p = (pointer)paVar2;
    }
    else {
      local_f68._prim_part.field_2._M_allocated_capacity = *plVar24;
      local_f68._prim_part._M_dataplus._M_p = (pointer)*plVar18;
    }
    local_f68._prim_part._M_string_length = plVar18[1];
    *plVar18 = (long)plVar24;
    plVar18[1] = 0;
    *(undefined1 *)(plVar18 + 2) = 0;
    uVar22 = ((long)(this->_specs).
                    super__Vector_base<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->_specs).
                    super__Vector_base<tinyusdz::crate::Spec,_std::allocator<tinyusdz::crate::Spec>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
    cVar11 = '\x01';
    if (9 < uVar22) {
      uVar23 = uVar22;
      cVar10 = '\x04';
      do {
        cVar11 = cVar10;
        if (uVar23 < 100) {
          cVar11 = cVar11 + -2;
          goto LAB_00188b10;
        }
        if (uVar23 < 1000) {
          cVar11 = cVar11 + -1;
          goto LAB_00188b10;
        }
        if (uVar23 < 10000) goto LAB_00188b10;
        bVar12 = 99999 < uVar23;
        uVar23 = uVar23 / 10000;
        cVar10 = cVar11 + '\x04';
      } while (bVar12);
      cVar11 = cVar11 + '\x01';
    }
LAB_00188b10:
    puVar7 = (undefined1 *)((long)&local_1078.contained + 8);
    local_1078._0_8_ = puVar7;
    ::std::__cxx11::string::_M_construct((ulong)&local_1078,cVar11);
    std::__detail::__to_chars_10_impl<unsigned_long>
              ((char *)local_1078._0_8_,local_1078.contained._0_4_,uVar22);
    uVar32 = (undefined1 *)0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f68._prim_part._M_dataplus._M_p != paVar2) {
      uVar32 = local_f68._prim_part.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar32 <
        (undefined1 *)
        ((long)local_1078.contained.data._0_8_ + local_f68._prim_part._M_string_length)) {
      uVar32 = (undefined1 *)0xf;
      if ((undefined1 *)local_1078._0_8_ != puVar7) {
        uVar32 = local_1078.contained._8_8_;
      }
      if ((ulong)uVar32 <
          (undefined1 *)
          ((long)local_1078.contained.data._0_8_ + local_f68._prim_part._M_string_length))
      goto LAB_00188b81;
      puVar17 = (undefined8 *)
                ::std::__cxx11::string::replace
                          ((ulong)&local_1078,0,(char *)0x0,
                           (ulong)local_f68._prim_part._M_dataplus._M_p);
    }
    else {
LAB_00188b81:
      puVar17 = (undefined8 *)::std::__cxx11::string::_M_append((char *)&local_f68,local_1078._0_8_)
      ;
    }
    local_e90._0_8_ = local_e90 + 0x10;
    puVar25 = puVar17 + 2;
    if ((ulong *)*puVar17 == puVar25) {
      local_e90._16_8_ = *puVar25;
      local_e90._24_8_ = puVar17[3];
    }
    else {
      local_e90._16_8_ = *puVar25;
      local_e90._0_8_ = (ulong *)*puVar17;
    }
    local_e90._8_8_ = *(anon_struct_8_0_00000001_for___align *)(puVar17 + 1);
    *puVar17 = puVar25;
    puVar17[1] = 0;
    *(char *)puVar25 = '\0';
    plVar18 = (long *)::std::__cxx11::string::append(local_e90);
    paVar36 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar18 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar18 == paVar36) {
      local_600[0]._0_8_ = paVar36->_M_allocated_capacity;
      local_600[0]._8_8_ = plVar18[3];
      local_610._0_8_ = local_600;
    }
    else {
      local_600[0]._0_8_ = paVar36->_M_allocated_capacity;
      local_610._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar18;
    }
    local_610._8_8_ = *(anon_struct_8_0_00000001_for___align *)(plVar18 + 1);
    *plVar18 = (long)paVar36;
    plVar18[1] = 0;
    *(undefined1 *)(plVar18 + 2) = 0;
    poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_cc0,(char *)local_610._0_8_,local_610._8_8_);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_610._0_8_ != local_600) {
      operator_delete((void *)local_610._0_8_,local_600[0]._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_e90._0_8_ != local_e90 + 0x10) {
      operator_delete((void *)local_e90._0_8_,local_e90._16_8_ + 1);
    }
    if ((undefined1 *)local_1078._0_8_ != puVar7) {
      operator_delete((void *)local_1078._0_8_,(ulong)(local_1078.contained._8_8_ + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f68._prim_part._M_dataplus._M_p != paVar2) {
      operator_delete(local_f68._prim_part._M_dataplus._M_p,
                      (ulong)(local_f68._prim_part.field_2._M_allocated_capacity + 1));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1048._M_elems[0]._M_dataplus._M_p != paVar26) {
      operator_delete(local_1048._M_elems[0]._M_dataplus._M_p,
                      (ulong)(local_1048._M_elems[0].field_2._M_allocated_capacity + 1));
    }
    if ((undefined1 *)local_10a8._0_8_ != local_10a8 + 0x10) {
      operator_delete((void *)local_10a8._0_8_,(ulong)(local_10a8._16_8_ + 1));
    }
    ::std::__cxx11::stringbuf::str();
    goto LAB_00188f6a;
  }
  if (((pSVar5[uVar23].spec_type == Relationship) || (pSVar5[uVar23].spec_type == Attribute)) &&
     (p_Var28 = (this->_prim_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
     p_Var28 != (_Base_ptr)0x0)) {
    p_Var1 = &(this->_prim_table)._M_t._M_impl.super__Rb_tree_header;
    p_Var33 = &p_Var1->_M_header;
    do {
      if (local_10bc <= (int)p_Var28[1]._M_color) {
        p_Var33 = p_Var28;
      }
      p_Var28 = (&p_Var28->_M_left)[(int)p_Var28[1]._M_color < local_10bc];
    } while (p_Var28 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var33 != p_Var1) && ((int)p_Var33[1]._M_color <= local_10bc)) {
      return true;
    }
  }
  pSVar5 = pSVar5 + uVar23;
  __x = &pSVar5->fieldset_index;
  sVar15 = ::std::
           map<tinyusdz::crate::Index,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>,_std::less<tinyusdz::crate::Index>,_std::allocator<std::pair<const_tinyusdz::crate::Index,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>_>_>_>
           ::count(&this->_live_fieldsets,__x);
  if (sVar15 == 0) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_cc0);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_cc0,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
               ,0x55);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_cc0,"ReconstructPrimSpecNode",0x17);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"():",3);
    poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)local_cc0,0xb13);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
    uVar3 = __x->value;
    cVar11 = '\x01';
    if (9 < uVar3) {
      uVar27 = uVar3;
      cVar10 = '\x04';
      do {
        cVar11 = cVar10;
        if (uVar27 < 100) {
          cVar11 = cVar11 + -2;
          goto LAB_00188dd6;
        }
        if (uVar27 < 1000) {
          cVar11 = cVar11 + -1;
          goto LAB_00188dd6;
        }
        if (uVar27 < 10000) goto LAB_00188dd6;
        bVar12 = 99999 < uVar27;
        uVar27 = uVar27 / 10000;
        cVar10 = cVar11 + '\x04';
      } while (bVar12);
      cVar11 = cVar11 + '\x01';
    }
LAB_00188dd6:
    paVar2 = &local_f68._prim_part.field_2;
    local_f68._prim_part._M_dataplus._M_p = (pointer)paVar2;
    ::std::__cxx11::string::_M_construct((ulong)&local_f68,cVar11);
    ::std::__detail::__to_chars_10_impl<unsigned_int>
              (local_f68._prim_part._M_dataplus._M_p,(uint)local_f68._prim_part._M_string_length,
               uVar3);
    puVar17 = (undefined8 *)
              ::std::__cxx11::string::replace((ulong)&local_f68,0,(char *)0x0,0x39acaf);
    puVar25 = puVar17 + 2;
    if ((ulong *)*puVar17 == puVar25) {
      local_e90._16_8_ = *puVar25;
      local_e90._24_8_ = puVar17[3];
      local_e90._0_8_ = local_e90 + 0x10;
    }
    else {
      local_e90._16_8_ = *puVar25;
      local_e90._0_8_ = (ulong *)*puVar17;
    }
    local_e90._8_8_ = *(anon_struct_8_0_00000001_for___align *)(puVar17 + 1);
    *puVar17 = puVar25;
    puVar17[1] = 0;
    *(undefined1 *)(puVar17 + 2) = 0;
    plVar18 = (long *)::std::__cxx11::string::append(local_e90);
    paVar26 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(plVar18 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar18 == paVar26) {
      local_600[0]._0_8_ = paVar26->_M_allocated_capacity;
      local_600[0]._8_8_ = plVar18[3];
      local_610._0_8_ = local_600;
    }
    else {
      local_600[0]._0_8_ = paVar26->_M_allocated_capacity;
      local_610._0_8_ =
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)*plVar18;
    }
    local_610._8_8_ = *(anon_struct_8_0_00000001_for___align *)(plVar18 + 1);
    *plVar18 = (long)paVar26;
    plVar18[1] = 0;
    *(undefined1 *)(plVar18 + 2) = 0;
    poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_cc0,(char *)local_610._0_8_,local_610._8_8_);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_610._0_8_ != local_600) {
      operator_delete((void *)local_610._0_8_,local_600[0]._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_e90._0_8_ != local_e90 + 0x10) {
      operator_delete((void *)local_e90._0_8_,local_e90._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f68._prim_part._M_dataplus._M_p != paVar2) {
      operator_delete(local_f68._prim_part._M_dataplus._M_p,
                      (ulong)(local_f68._prim_part.field_2._M_allocated_capacity + 1));
    }
    ::std::__cxx11::stringbuf::str();
    goto LAB_00188f6a;
  }
  fvs = ::std::
        map<tinyusdz::crate::Index,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>,_std::less<tinyusdz::crate::Index>,_std::allocator<std::pair<const_tinyusdz::crate::Index,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>_>_>_>
        ::at(&this->_live_fieldsets,__x);
  uVar23 = ((long)(fvs->
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(fvs->
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::crate::CrateValue>_>_>
                  )._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
  uVar22 = (ulong)(this->_config).kMaxFieldValuePairs;
  if (uVar22 <= uVar23 && uVar23 - uVar22 != 0) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_cc0);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_cc0,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
               ,0x55);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"[USDC]",6);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_cc0,"ReconstructPrimSpecNode",0x17);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"():",3);
    poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)local_cc0,0xb1b);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
    pcVar30 = "Too much FieldValue pairs.";
    lVar29 = 0x1a;
    goto LAB_00188680;
  }
  if (local_10c0.value == 0) {
    pPVar34 = (this->_elemPaths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((this->_elemPaths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>.
        _M_impl.super__Vector_impl_data._M_finish == pPVar34) {
      local_610._0_8_ = (ulong)(uint7)local_610._1_7_ << 8;
      memset((Path *)(local_610 + 8),0,0xd0);
    }
    else {
      local_610[0] = 1;
      Path::Path((Path *)(local_610 + 8),pPVar34);
      if ((local_610._0_8_ & 1) != 0) {
        Path::~Path((Path *)(local_610 + 8));
        if (pSVar5->spec_type == PseudoRoot) {
          bVar12 = ReconstrcutStageMeta(this,fvs,&layer->_metas);
          if (bVar12) {
            ::std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>
                      ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                       &this->_prim_table,(int *)&local_10c0);
            return true;
          }
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_cc0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_cc0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_cc0,"ReconstructPrimSpecNode",0x17);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"():",3);
          poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)local_cc0,0xb36);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
          pcVar30 = "Failed to reconstruct StageMeta.";
          lVar29 = 0x20;
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_cc0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_cc0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_cc0,"ReconstructPrimSpecNode",0x17);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"():",3);
          poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)local_cc0,0xb32);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
          pcVar30 = "SpecTypePseudoRoot expected for root layer(Stage) element.";
          lVar29 = 0x3a;
        }
        goto LAB_00188680;
      }
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_cc0);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_cc0,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
               ,0x55);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_cc0,"ReconstructPrimSpecNode",0x17);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"():",3);
    poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)local_cc0,0xb2c);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_cc0,"(Internal error). Root Element Path not found.",0x2e);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"\n",1);
    ::std::__cxx11::stringbuf::str();
    PushError(this,(string *)local_e90);
    if ((undefined1 *)local_e90._0_8_ != local_e90 + 0x10) {
      operator_delete((void *)local_e90._0_8_,local_e90._16_8_ + 1);
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_cc0);
    ::std::ios_base::~ios_base((ios_base *)(local_c60 + 0x10));
    if ((bool)local_610[0] != true) goto LAB_00188fb3;
    pPVar34 = (Path *)(local_610 + 8);
LAB_00189116:
    Path::~Path(pPVar34);
    goto LAB_00188fb3;
  }
  bVar12 = true;
  args = &switchD_001888c9::switchdataD_0039aad4;
  switch(pSVar5->spec_type) {
  case Unknown:
  case Invalid:
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_cc0);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_cc0,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
               ,0x55);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"[USDC]",6);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_cc0,"ReconstructPrimSpecNode",0x17);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"():",3);
    poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)local_cc0,0xcc8);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
    pcVar30 = "[InternalError] Invalid SpecType.";
    lVar29 = 0x21;
    goto LAB_00188680;
  case Attribute:
    if (!is_parent_variant) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_cc0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"[warn]",6);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_cc0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                 ,0x55);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_cc0,"ReconstructPrimSpecNode",0x17);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"():",3);
      poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)local_cc0,0xcb3);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_cc0,
                 "TODO: SpecTypeAttribute(in conjunction with Class/Over specifier, or inherited?)",
                 0x50);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"\n",1);
      ::std::__cxx11::stringbuf::str();
      PushWarn(this,(string *)local_610);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_610._0_8_ != local_600) {
        operator_delete((void *)local_610._0_8_,local_600[0]._M_allocated_capacity + 1);
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_cc0);
      ::std::ios_base::~ios_base((ios_base *)(local_c60 + 0x10));
      return true;
    }
    GetPath((optional<tinyusdz::Path> *)local_cc0,this,(Index)(pSVar5->path_index).value);
    local_e90[0] = (fmt)local_cc0[0];
    if (local_cc0[0] == (ostringstream)0x1) {
      Path::Path((Path *)(local_e90 + 8),(Path *)local_cb8);
    }
    if (((byte)local_cc0[0] & 1) != 0) {
      Path::~Path((Path *)local_cb8);
    }
    if (local_e90[0] == (fmt)0x0) {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_cc0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_cc0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                 ,0x55);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"[USDC]",6);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_cc0,"ReconstructPrimSpecNode",0x17);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"():",3);
      poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)local_cc0,0xc9c);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_cc0,"Invalid PathIndex.",0x12);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"\n",1);
      ::std::__cxx11::stringbuf::str();
      PushError(this,(string *)local_610);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_610._0_8_ != local_600) {
        operator_delete((void *)local_610._0_8_,local_600[0]._M_allocated_capacity + 1);
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_cc0);
      ::std::ios_base::~ios_base((ios_base *)(local_c60 + 0x10));
      if (local_e90[0] == (fmt)0x1) {
        pPVar34 = (Path *)(local_e90 + 8);
        goto LAB_00189116;
      }
    }
    else {
      this_02 = (Property *)local_610;
      Property::Property(this_02);
      bVar12 = ParseProperty(this,pSVar5->spec_type,fvs,this_02);
      if (bVar12) {
        if (local_e90[0] == (fmt)0x0) {
LAB_0018bae7:
          __assert_fail("has_value()",
                        "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/nonstd/optional.hpp"
                        ,0x591,
                        "value_type &nonstd::optional_lite::optional<tinyusdz::Path>::value() [T = tinyusdz::Path]"
                       );
        }
        Path::Path((Path *)local_cc0,(Path *)(local_e90 + 8));
        Property::Property((Property *)local_bf0,(Property *)local_610);
        this_00 = ::std::
                  map<int,_std::pair<tinyusdz::Path,_tinyusdz::Property>,_std::less<int>,_std::allocator<std::pair<const_int,_std::pair<tinyusdz::Path,_tinyusdz::Property>_>_>_>
                  ::operator[](&this->_variantProps,(key_type_conflict2 *)&local_10c0);
        Path::operator=(&this_00->first,(Path *)local_cc0);
        Property::operator=(&this_00->second,(Property *)local_bf0);
        Property::~Property((Property *)local_bf0);
        Path::~Path((Path *)local_cc0);
        pvVar21 = (vector<int,std::allocator<int>> *)
                  ::std::
                  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                  ::operator[](&this->_variantPropChildren,&local_10bc);
        iVar6._M_current = *(int **)(pvVar21 + 8);
        if (iVar6._M_current == *(int **)(pvVar21 + 0x10)) {
          ::std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                    (pvVar21,iVar6,(int *)&local_10c0);
        }
        else {
          *iVar6._M_current = local_10c0.value;
          *(int **)(pvVar21 + 8) = iVar6._M_current + 1;
        }
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_cc0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_cc0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                   ,0x55);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"[USDC]",6);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_cc0,"ReconstructPrimSpecNode",0x17);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"():",3);
        poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)local_cc0,0xca3);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
        paVar26 = &local_1048._M_elems[0].field_2;
        local_1048._M_elems[0]._M_dataplus._M_p = (pointer)paVar26;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_1048,"Failed to parse Attribut: {}.","");
        if (local_e90[0] == (fmt)0x0) goto LAB_0018bae7;
        fmt::format<std::__cxx11::string>
                  (&local_f68._prim_part,(fmt *)&local_1048,(string *)local_e68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_02);
        poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_cc0,local_f68._prim_part._M_dataplus._M_p,
                             local_f68._prim_part._M_string_length);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
        paVar2 = &local_f68._prim_part.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f68._prim_part._M_dataplus._M_p != paVar2) {
          operator_delete(local_f68._prim_part._M_dataplus._M_p,
                          (ulong)(local_f68._prim_part.field_2._M_allocated_capacity + 1));
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1048._M_elems[0]._M_dataplus._M_p != paVar26) {
          operator_delete(local_1048._M_elems[0]._M_dataplus._M_p,
                          (ulong)(local_1048._M_elems[0].field_2._M_allocated_capacity + 1));
        }
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)&local_f68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f68._prim_part._M_dataplus._M_p != paVar2) {
          operator_delete(local_f68._prim_part._M_dataplus._M_p,
                          (ulong)(local_f68._prim_part.field_2._M_allocated_capacity + 1));
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_cc0);
        ::std::ios_base::~ios_base((ios_base *)(local_c60 + 0x10));
      }
      Property::~Property((Property *)local_610);
      if (local_e90[0] == (fmt)0x1) {
        Path::~Path((Path *)(local_e90 + 8));
      }
      if (bVar12) {
        return true;
      }
    }
    break;
  case Connection:
  case Relationship:
  case RelationshipTarget:
    local_10b8 = this;
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_cc0);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_cc0,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
               ,0x55);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"[USDC]",6);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_cc0,"ReconstructPrimSpecNode",0x17);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"():",3);
    poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)local_cc0,0xcbc);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
    pcVar31 = "TODO: Unsupported/Unimplemented SpecType: {}.";
    pcVar30 = "";
    goto LAB_001891e8;
  case Expression:
  case Mapper:
  case MapperArg:
    local_10b8 = this;
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_cc0);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_cc0,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
               ,0x55);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"[USDC]",6);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_cc0,"ReconstructPrimSpecNode",0x17);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"():",3);
    poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)local_cc0,0xcc3);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
    pcVar31 = "Unsupported SpecType: {}.";
    pcVar30 = "";
LAB_001891e8:
    local_e90._0_8_ = local_e90 + 0x10;
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_e90,pcVar31,pcVar30);
    tinyusdz::to_string_abi_cxx11_((string *)&local_f68,(tinyusdz *)(ulong)pSVar5->spec_type,ty);
    fmt::format<std::__cxx11::string>
              ((string *)local_610,(fmt *)local_e90,&local_f68._prim_part,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
    poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_cc0,(char *)local_610._0_8_,local_610._8_8_);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_610._0_8_ != local_600) {
      operator_delete((void *)local_610._0_8_,local_600[0]._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f68._prim_part._M_dataplus._M_p != &local_f68._prim_part.field_2) {
      operator_delete(local_f68._prim_part._M_dataplus._M_p,
                      (ulong)(local_f68._prim_part.field_2._M_allocated_capacity + 1));
    }
    if ((undefined1 *)local_e90._0_8_ != local_e90 + 0x10) {
      operator_delete((void *)local_e90._0_8_,local_e90._16_8_ + 1);
    }
    ::std::__cxx11::stringbuf::str();
    PushError(local_10b8,(string *)local_610);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_610._0_8_ != local_600) goto LAB_00188f82;
    goto LAB_00188f92;
  case Prim:
    local_10a8._0_8_ = local_10a8._0_8_ & 0xffffffffffffff00;
    local_10a8._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
    local_10a8._16_8_ = (_Link_type)0x0;
    local_1090._0_8_ = (undefined1 *)0x0;
    local_1090._8_8_ = (undefined1 *)0x0;
    local_d18 = (undefined1  [4])((uint)local_d18 & 0xffffff00);
    sStack_d14 = (storage_t<tinyusdz::Specifier>)0x0;
    local_f78[0] = 0;
    local_f88._M_allocated_capacity = 0;
    local_f88._8_8_ = 0;
    local_fa8._16_8_ = (pointer)0x0;
    local_fa8._0_8_ = (pointer)0x0;
    local_fa8._8_8_ = (pointer)0x0;
    PrimMetas::PrimMetas((PrimMetas *)local_610);
    local_10b8 = this;
    bVar12 = ParsePrimSpec(this,fvs,(optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                     *)local_10a8,(optional<tinyusdz::Specifier> *)local_d18,
                           (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&local_f88,
                           (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_fa8,
                           (PrimMeta *)local_610);
    pIVar8 = local_10b8;
    if (bVar12) {
      local_f68._prim_part._M_dataplus._M_p = (pointer)&local_f68._prim_part.field_2;
      local_f68._prim_part._M_string_length = 0;
      local_f68._prim_part.field_2._M_allocated_capacity =
           local_f68._prim_part.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_f68._prop_part._M_dataplus._M_p = (pointer)&local_f68._prop_part.field_2;
      local_f68._prop_part._M_string_length = 0;
      local_f68._prop_part.field_2._M_local_buf[0] = '\0';
      local_f68._variant_part._M_dataplus._M_p = (pointer)&local_f68._variant_part.field_2;
      local_f68._variant_part._M_string_length = 0;
      local_f68._variant_part.field_2._M_local_buf[0] = '\0';
      local_f68._variant_selection_part._M_dataplus._M_p =
           (pointer)&local_f68._variant_selection_part.field_2;
      local_f68._variant_selection_part._M_string_length = 0;
      local_f68._variant_selection_part.field_2._M_local_buf[0] = '\0';
      local_f68._variant_part_str._M_dataplus._M_p = (pointer)&local_f68._variant_part_str.field_2;
      local_f68._variant_part_str._M_string_length = 0;
      local_f68._variant_part_str.field_2._M_local_buf[0] = '\0';
      local_f68._element._M_dataplus._M_p = (pointer)&local_f68._element.field_2;
      local_f68._element._M_string_length = 0;
      local_f68._element.field_2._M_local_buf[0] = '\0';
      local_f68._path_type.has_value_ = false;
      local_f68._path_type.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
      local_f68._valid = false;
      GetElemPath((optional<tinyusdz::Path> *)local_e90,local_10b8,local_10c0);
      fVar9 = local_e90[0];
      if (local_e90[0] == (fmt)0x1) {
        Path::operator=(&local_f68,(Path *)(local_e90 + 8));
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_cc0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_cc0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                   ,0x55);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"[USDC]",6);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_cc0,"ReconstructPrimSpecNode",0x17);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"():",3);
        poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)local_cc0,0xb5d);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_cc0,"(Internal errror) Element path not found.",0x29);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"\n",1);
        ::std::__cxx11::stringbuf::str();
        PushError(pIVar8,local_1048._M_elems);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1048._M_elems[0]._M_dataplus._M_p != &local_1048._M_elems[0].field_2) {
          operator_delete(local_1048._M_elems[0]._M_dataplus._M_p,
                          (ulong)(local_1048._M_elems[0].field_2._M_allocated_capacity + 1));
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_cc0);
        ::std::ios_base::~ios_base((ios_base *)(local_c60 + 0x10));
      }
      if (local_e90[0] == (fmt)0x1) {
        Path::~Path((Path *)(local_e90 + 8));
      }
      if (fVar9 == (fmt)0x0) {
LAB_0018a69f:
        bVar12 = false;
      }
      else {
        if ((local_d18[0] == true) && (2 < (uint)sStack_d14)) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_cc0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_cc0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"[USDC]",6);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_cc0,"ReconstructPrimSpecNode",0x17);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"():",3);
          poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)local_cc0,0xb69);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_cc0,"Invalid Specifier.",0x12);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"\n",1);
          ::std::__cxx11::stringbuf::str();
          PushError(pIVar8,(string *)local_e90);
          if ((undefined1 *)local_e90._0_8_ != local_e90 + 0x10) {
            operator_delete((void *)local_e90._0_8_,local_e90._16_8_ + 1);
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_cc0);
          ::std::ios_base::~ios_base((ios_base *)(local_c60 + 0x10));
          goto LAB_0018a69f;
        }
        puVar7 = (undefined1 *)((long)&local_1078.contained + 8);
        local_1078.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
        local_1078.contained._8_8_ = local_1078.contained._8_8_ & 0xffffffffffffff00;
        local_1078._0_8_ = puVar7;
        if (local_10a8[0] == (fmt)0x0) {
          ::std::__cxx11::string::operator=((string *)&local_1078,"Model");
        }
        else {
          ::std::__cxx11::string::_M_assign((string *)&local_1078);
        }
        local_fe8._M_dataplus._M_p = (pointer)&local_fe8.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_fe8,local_f68._prim_part._M_dataplus._M_p,
                   local_f68._prim_part._M_dataplus._M_p + local_f68._prim_part._M_string_length);
        paVar26 = &local_1008.field_2;
        local_1008._M_dataplus._M_p = (pointer)paVar26;
        if (local_10a8[0] == (fmt)0x1) {
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_1008,local_10a8._8_8_,
                     (undefined1 *)(local_10a8._16_8_ + local_10a8._8_8_));
        }
        else {
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_1008,"");
        }
        if ((local_10a8[0] == (fmt)0x1) &&
           (iVar13 = ::std::__cxx11::string::compare(local_10a8 + 8), iVar13 == 0)) {
          ::std::__cxx11::string::operator=((string *)&local_1008,"");
        }
        bVar12 = ValidatePrimElementName(&local_fe8);
        if (bVar12) {
          PrimSpec::PrimSpec((PrimSpec *)local_cc0);
          ::std::__cxx11::string::_M_assign((string *)local_cb8);
          ::std::__cxx11::string::_M_assign(local_c98);
          local_1048._M_elems[0].field_2._8_8_ = &local_1048._M_elems[0]._M_string_length;
          local_1048._M_elems[0]._M_string_length =
               (ulong)local_1048._M_elems[0]._M_string_length._4_4_ << 0x20;
          local_1048._M_elems[0].field_2._M_allocated_capacity = 0;
          local_1048._M_elems[1]._M_string_length = 0;
          local_1048._M_elems[1]._M_dataplus._M_p = (pointer)local_1048._M_elems[0].field_2._8_8_;
          bVar12 = BuildPropertyMap(pIVar8,&pNVar4[current]._children,local_1050,
                                    (PropertyMap *)&local_1048);
          if (bVar12) {
            ::std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
            ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                         *)local_c60,
                        (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                         *)&local_1048);
            PrimMetas::operator=((PrimMetas *)(local_bf0 + 0x68),(PrimMetas *)local_610);
            if (primOut != (optional<tinyusdz::PrimSpec> *)0x0) {
              nonstd::optional_lite::optional<tinyusdz::PrimSpec>::operator=
                        (primOut,(PrimSpec *)local_cc0);
            }
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_e90);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_e90,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_e90,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                       ,0x55);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_e90,"[USDC]",6);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_e90,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_e90,"ReconstructPrimSpecNode",0x17);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_e90,"():",3);
            poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)local_e90,0xba8);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_e90,"Failed to build PropertyMap.",0x1c);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_e90,"\n",1);
            ::std::__cxx11::stringbuf::str();
            PushError(pIVar8,&local_fc8);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_fc8._M_dataplus._M_p != &local_fc8.field_2) {
              operator_delete(local_fc8._M_dataplus._M_p,local_fc8.field_2._M_allocated_capacity + 1
                             );
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_e90);
            ::std::ios_base::~ios_base((ios_base *)local_e20[0]._M_local_buf);
          }
          ::std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
          ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                      *)&local_1048,(_Link_type)local_1048._M_elems[0].field_2._M_allocated_capacity
                    );
          PrimSpec::~PrimSpec((PrimSpec *)local_cc0);
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_cc0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_cc0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"[USDC]",6);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_cc0,"ReconstructPrimSpecNode",0x17);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"():",3);
          poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)local_cc0,0xb84);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_cc0,"Invalid Prim name.",0x12);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"\n",1);
          ::std::__cxx11::stringbuf::str();
          PushError(pIVar8,(string *)local_e90);
          if ((undefined1 *)local_e90._0_8_ != local_e90 + 0x10) {
            operator_delete((void *)local_e90._0_8_,local_e90._16_8_ + 1);
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_cc0);
          ::std::ios_base::~ios_base((ios_base *)(local_c60 + 0x10));
          bVar12 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1008._M_dataplus._M_p != paVar26) {
          operator_delete(local_1008._M_dataplus._M_p,local_1008.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_fe8._M_dataplus._M_p != &local_fe8.field_2) {
          operator_delete(local_fe8._M_dataplus._M_p,
                          CONCAT71(local_fe8.field_2._M_allocated_capacity._1_7_,
                                   local_fe8.field_2._M_local_buf[0]) + 1);
        }
        if (bVar12 != false) {
          sVar19 = ::std::set<int,_std::less<int>,_std::allocator<int>_>::count
                             (&pIVar8->_prim_table,(key_type_conflict2 *)&local_10c0);
          if (sVar19 == 0) {
            ::std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
            _M_insert_unique<int_const&>
                      ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                       &pIVar8->_prim_table,(int *)&local_10c0);
          }
        }
        if ((undefined1 *)local_1078._0_8_ != puVar7) {
          operator_delete((void *)local_1078._0_8_,(ulong)(local_1078.contained._8_8_ + 1));
        }
      }
      Path::~Path(&local_f68);
      PrimMetas::~PrimMetas((PrimMetas *)local_610);
      ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_fa8);
      ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&local_f88);
      if ((local_10a8[0] == (fmt)0x1) &&
         (uVar32 = local_1090._0_8_, uVar35 = local_10a8._8_8_,
         (undefined1 *)local_10a8._8_8_ != local_1090)) {
LAB_0018bab3:
        operator_delete((void *)uVar35,(ulong)(uVar32 + 1));
      }
LAB_0018babb:
      if (bVar12 != false) {
        return true;
      }
    }
    else {
      ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_cc0);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"[error]",7);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_cc0,
                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                 ,0x55);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"[USDC]",6);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,":",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_cc0,"ReconstructPrimSpecNode",0x17);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"():",3);
      poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)local_cc0,0xb50);
      ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
      ::std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_cc0,"Failed to parse Prim fields.",0x1c);
      ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"\n",1);
      ::std::__cxx11::stringbuf::str();
      PushError(local_10b8,(string *)local_e90);
      if ((undefined1 *)local_e90._0_8_ != local_e90 + 0x10) {
        operator_delete((void *)local_e90._0_8_,local_e90._16_8_ + 1);
      }
      ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_cc0);
      ::std::ios_base::~ios_base((ios_base *)(local_c60 + 0x10));
      PrimMetas::~PrimMetas((PrimMetas *)local_610);
      ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)local_fa8);
      ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
                ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&local_f88);
      if ((local_10a8[0] == (fmt)0x1) &&
         (uVar32 = local_1090._0_8_, uVar35 = local_10a8._8_8_,
         (undefined1 *)local_10a8._8_8_ != local_1090)) {
LAB_00189e08:
        operator_delete((void *)uVar35,(ulong)(uVar32 + 1));
      }
    }
    break;
  case PseudoRoot:
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_cc0);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_cc0,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
               ,0x55);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"[USDC]",6);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_cc0,"ReconstructPrimSpecNode",0x17);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"():",3);
    poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)local_cc0,0xb43);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
    pcVar30 = "SpecType PseudoRoot in a child node is not supported(yet)";
    lVar29 = 0x39;
    goto LAB_00188680;
  case Variant:
    local_1078._0_8_ = local_1078._0_8_ & 0xffffffffffffff00;
    local_1078.contained.data.__align = (anon_struct_8_0_00000001_for___align)0x0;
    local_1078.contained._8_8_ = (undefined1 *)0x0;
    local_1078.contained._16_8_ = (undefined1 *)0x0;
    local_1078.contained._24_8_ = 0;
    local_10b0.has_value_ = false;
    local_10b0.contained = (storage_t<tinyusdz::Specifier>)0x0;
    local_cf8.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_cf8.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_cf8.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_cd8.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_cd8.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_cd8.super__Vector_base<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    PrimMetas::PrimMetas((PrimMetas *)local_610);
    local_10b8 = this;
    bVar12 = ParsePrimSpec(this,fvs,&local_1078,&local_10b0,&local_cf8,&local_cd8,
                           (PrimMeta *)local_610);
    pIVar8 = local_10b8;
    if (bVar12) {
      local_f68._prim_part._M_dataplus._M_p = (pointer)&local_f68._prim_part.field_2;
      local_f68._prim_part._M_string_length = 0;
      local_f68._prim_part.field_2._M_allocated_capacity =
           local_f68._prim_part.field_2._M_allocated_capacity & 0xffffffffffffff00;
      local_f68._prop_part._M_dataplus._M_p = (pointer)&local_f68._prop_part.field_2;
      local_f68._prop_part._M_string_length = 0;
      local_f68._prop_part.field_2._M_local_buf[0] = '\0';
      local_f68._variant_part._M_dataplus._M_p = (pointer)&local_f68._variant_part.field_2;
      local_f68._variant_part._M_string_length = 0;
      local_f68._variant_part.field_2._M_local_buf[0] = '\0';
      local_f68._variant_selection_part._M_dataplus._M_p =
           (pointer)&local_f68._variant_selection_part.field_2;
      local_f68._variant_selection_part._M_string_length = 0;
      local_f68._variant_selection_part.field_2._M_local_buf[0] = '\0';
      local_f68._variant_part_str._M_dataplus._M_p = (pointer)&local_f68._variant_part_str.field_2;
      local_f68._variant_part_str._M_string_length = 0;
      local_f68._variant_part_str.field_2._M_local_buf[0] = '\0';
      local_f68._element._M_dataplus._M_p = (pointer)&local_f68._element.field_2;
      local_f68._element._M_string_length = 0;
      local_f68._element.field_2._M_local_buf[0] = '\0';
      local_f68._path_type.has_value_ = false;
      local_f68._path_type.contained = (storage_t<tinyusdz::Path::PathType>)0x0;
      local_f68._valid = false;
      GetElemPath((optional<tinyusdz::Path> *)local_e90,local_10b8,local_10c0);
      fVar9 = local_e90[0];
      if (local_e90[0] == (fmt)0x1) {
        Path::operator=(&local_f68,(Path *)(local_e90 + 8));
        psmap_00 = local_1050;
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_cc0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_cc0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                   ,0x55);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"[USDC]",6);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_cc0,"ReconstructPrimSpecNode",0x17);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"():",3);
        poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)local_cc0,0xc0f);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_cc0,"(Internal errror) Element path not found.",0x29);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"\n",1);
        ::std::__cxx11::stringbuf::str();
        PushError(pIVar8,local_1048._M_elems);
        psmap_00 = local_1050;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1048._M_elems[0]._M_dataplus._M_p != &local_1048._M_elems[0].field_2) {
          operator_delete(local_1048._M_elems[0]._M_dataplus._M_p,
                          (ulong)(local_1048._M_elems[0].field_2._M_allocated_capacity + 1));
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_cc0);
        ::std::ios_base::~ios_base((ios_base *)(local_c60 + 0x10));
      }
      if (local_e90[0] == (fmt)0x1) {
        Path::~Path((Path *)(local_e90 + 8));
      }
      if (fVar9 == (fmt)0x0) {
LAB_0018a3f0:
        bVar12 = false;
      }
      else {
        if (local_10b0.has_value_ == true) {
          if (2 < (uint)local_10b0.contained) {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_cc0);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_cc0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                       ,0x55);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"[USDC]",6);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_cc0,"ReconstructPrimSpecNode",0x17);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"():",3);
            poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)local_cc0,0xc1b);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_cc0,"Invalid Specifier.",0x12);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"\n",1);
            ::std::__cxx11::stringbuf::str();
            PushError(pIVar8,(string *)local_e90);
            if ((undefined1 *)local_e90._0_8_ != local_e90 + 0x10) {
              operator_delete((void *)local_e90._0_8_,local_e90._16_8_ + 1);
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_cc0);
            ::std::ios_base::~ios_base((ios_base *)(local_c60 + 0x10));
            goto LAB_0018a3f0;
          }
        }
        else {
          local_10b0.contained = (storage_t<tinyusdz::Specifier>)0x0;
          local_10b0.has_value_ = true;
        }
        local_fe8._M_dataplus._M_p = (pointer)&local_fe8.field_2;
        local_fe8._M_string_length = 0;
        local_fe8.field_2._M_local_buf[0] = '\0';
        if ((string)local_1078.has_value_ == (string)0x0) {
          ::std::__cxx11::string::operator=((string *)&local_fe8,"Model");
        }
        else {
          ::std::__cxx11::string::_M_assign((string *)&local_fe8);
        }
        local_1008._M_dataplus._M_p = (pointer)&local_1008.field_2;
        ::std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1008,local_f68._prim_part._M_dataplus._M_p,
                   local_f68._prim_part._M_dataplus._M_p + local_f68._prim_part._M_string_length);
        paVar26 = &local_fc8.field_2;
        local_fc8._M_dataplus._M_p = (pointer)paVar26;
        if ((string)local_1078.has_value_ == (string)0x1) {
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_fc8,local_1078.contained.data.__align,
                     (undefined1 *)
                     (local_1078.contained._8_8_ + (long)local_1078.contained.data._0_8_));
        }
        else {
          ::std::__cxx11::string::_M_construct<char_const*>((string *)&local_fc8,"");
        }
        if (((string)local_1078.has_value_ == (string)0x1) &&
           (iVar13 = ::std::__cxx11::string::compare((char *)&local_1078.contained), iVar13 == 0)) {
          ::std::__cxx11::string::operator=((string *)&local_fc8,"");
        }
        lVar29 = 0x10;
        do {
          args_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                    ((long)&local_1048._M_elems[0]._M_dataplus._M_p + lVar29);
          *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)
           ((long)&local_1078.contained + lVar29 + 0x18U) = args_00;
          *(undefined8 *)((long)&local_1050 + lVar29) = 0;
          *(undefined1 *)&(args_00->_M_dataplus)._M_p = 0;
          lVar29 = lVar29 + 0x20;
        } while (lVar29 != 0x50);
        bVar12 = tokenize_variantElement(&local_1008,&local_1048);
        if (bVar12) {
          local_f88._M_allocated_capacity = (size_type)local_f78;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_f88,local_1048._M_elems[0]._M_dataplus._M_p,
                     local_1048._M_elems[0]._M_dataplus._M_p +
                     local_1048._M_elems[0]._M_string_length);
          local_fa8._0_8_ = local_fa8 + 0x10;
          ::std::__cxx11::string::_M_construct<char*>
                    ((string *)local_fa8,local_1048._M_elems[1]._M_dataplus._M_p,
                     local_1048._M_elems[1]._M_dataplus._M_p +
                     local_1048._M_elems[1]._M_string_length);
          bVar12 = ValidatePrimElementName((string *)local_fa8);
          if (bVar12) {
            PrimSpec::PrimSpec((PrimSpec *)local_cc0);
            ::std::__cxx11::string::_M_assign((string *)local_cb8);
            ::std::__cxx11::string::_M_assign(local_c98);
            local_1090._0_8_ = local_10a8 + 8;
            local_10a8._8_8_ = (ulong)(uint)local_10a8._12_4_ << 0x20;
            local_10a8._16_8_ = (_Link_type)0x0;
            local_1080 = 0;
            local_1090._8_8_ = local_1090._0_8_;
            bVar12 = BuildPropertyMap(pIVar8,&pNVar4[current]._children,psmap_00,
                                      (PropertyMap *)local_10a8);
            if (bVar12) {
              ::std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
              ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                           *)local_c60,
                          (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                           *)local_10a8);
              PrimMetas::operator=((PrimMetas *)(local_bf0 + 0x68),(PrimMetas *)local_610);
              sVar20 = ::std::
                       map<int,_tinyusdz::PrimSpec,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::PrimSpec>_>_>
                       ::count(&pIVar8->_variantPrimSpecs,(key_type_conflict2 *)&local_10c0);
              if (sVar20 == 0) {
                this_01 = ::std::
                          map<int,_tinyusdz::PrimSpec,_std::less<int>,_std::allocator<std::pair<const_int,_tinyusdz::PrimSpec>_>_>
                          ::operator[](&pIVar8->_variantPrimSpecs,(key_type_conflict2 *)&local_10c0)
                ;
                if (this_01 != (PrimSpec *)local_cc0) {
                  PrimSpec::CopyFrom(this_01,(PrimSpec *)local_cc0);
                }
                pvVar21 = (vector<int,std::allocator<int>> *)
                          ::std::
                          map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
                          ::operator[](&pIVar8->_variantPrimChildren,&local_10bc);
                iVar6._M_current = *(int **)(pvVar21 + 8);
                if (iVar6._M_current == *(int **)(pvVar21 + 0x10)) {
                  ::std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            (pvVar21,iVar6,(int *)&local_10c0);
                }
                else {
                  *iVar6._M_current = local_10c0.value;
                  *(int **)(pvVar21 + 8) = iVar6._M_current + 1;
                }
              }
            }
            else {
              ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_e90);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_e90,"[error]",7)
              ;
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_e90,
                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                         ,0x55);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_e90,"[USDC]",6);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_e90,":",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_e90,"ReconstructPrimSpecNode",0x17);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_e90,"():",3);
              poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)local_e90,0xc84);
              ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
              ::std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_e90,"Failed to build PropertyMap.",0x1c);
              ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_e90,"\n",1);
              ::std::__cxx11::stringbuf::str();
              PushError(pIVar8,(string *)local_d18);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT44(sStack_d14,local_d18) != &local_d08) {
                operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)CONCAT44(sStack_d14,local_d18),
                                local_d08._M_allocated_capacity + 1);
              }
              ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_e90);
              ::std::ios_base::~ios_base((ios_base *)local_e20[0]._M_local_buf);
            }
            ::std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
            ::_M_erase((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::Property>_>_>
                        *)local_10a8,(_Link_type)local_10a8._16_8_);
            PrimSpec::~PrimSpec((PrimSpec *)local_cc0);
          }
          else {
            ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_cc0);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"[error]",7);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_cc0,
                       "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                       ,0x55);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"[USDC]",6);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,":",1);
            ::std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)local_cc0,"ReconstructPrimSpecNode",0x17);
            ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"():",3);
            poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)local_cc0,0xc45);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
            local_10a8._0_8_ = local_10a8 + 0x10;
            ::std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_10a8,"Invalid Prim name in Variant: `{}`","");
            fmt::format<std::__cxx11::string>
                      ((string *)local_e90,(fmt *)local_10a8,(string *)local_fa8,args_00);
            poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)local_cc0,(char *)local_e90._0_8_,local_e90._8_8_);
            ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
            if ((undefined1 *)local_e90._0_8_ != local_e90 + 0x10) {
              operator_delete((void *)local_e90._0_8_,local_e90._16_8_ + 1);
            }
            if ((undefined1 *)local_10a8._0_8_ != local_10a8 + 0x10) {
              operator_delete((void *)local_10a8._0_8_,(ulong)(local_10a8._16_8_ + 1));
            }
            ::std::__cxx11::stringbuf::str();
            PushError(pIVar8,(string *)local_e90);
            if ((undefined1 *)local_e90._0_8_ != local_e90 + 0x10) {
              operator_delete((void *)local_e90._0_8_,local_e90._16_8_ + 1);
            }
            ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_cc0);
            ::std::ios_base::~ios_base((ios_base *)(local_c60 + 0x10));
            bVar12 = false;
          }
          if ((pointer)local_fa8._0_8_ != (pointer)(local_fa8 + 0x10)) {
            operator_delete((void *)local_fa8._0_8_,(ulong)(local_fa8._16_8_ + 1));
          }
          if ((long *)local_f88._M_allocated_capacity != local_f78) {
            operator_delete((void *)local_f88._M_allocated_capacity,local_f78[0] + 1);
          }
        }
        else {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_cc0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_cc0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"[USDC]",6);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_cc0,"ReconstructPrimSpecNode",0x17);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"():",3);
          poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)local_cc0,0xc3c);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
          local_10a8._0_8_ = local_10a8 + 0x10;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_10a8,"Invalid Variant ElementPath \'{}\'.","");
          fmt::format<tinyusdz::Path>((string *)local_e90,(string *)local_10a8,&local_f68);
          poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_cc0,(char *)local_e90._0_8_,local_e90._8_8_);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
          if ((undefined1 *)local_e90._0_8_ != local_e90 + 0x10) {
            operator_delete((void *)local_e90._0_8_,local_e90._16_8_ + 1);
          }
          if ((undefined1 *)local_10a8._0_8_ != local_10a8 + 0x10) {
            operator_delete((void *)local_10a8._0_8_,(ulong)(local_10a8._16_8_ + 1));
          }
          ::std::__cxx11::stringbuf::str();
          PushError(pIVar8,(string *)local_e90);
          if ((undefined1 *)local_e90._0_8_ != local_e90 + 0x10) {
            operator_delete((void *)local_e90._0_8_,local_e90._16_8_ + 1);
          }
          ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_cc0);
          ::std::ios_base::~ios_base((ios_base *)(local_c60 + 0x10));
          bVar12 = false;
        }
        lVar29 = -0x40;
        paVar36 = &local_1048._M_elems[1].field_2;
        do {
          if (paVar36 !=
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(&paVar36->_M_allocated_capacity)[-2]) {
            operator_delete((long *)(&paVar36->_M_allocated_capacity)[-2],
                            paVar36->_M_allocated_capacity + 1);
          }
          paVar36 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(&paVar36->_M_allocated_capacity + -4);
          lVar29 = lVar29 + 0x20;
        } while (lVar29 != 0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_fc8._M_dataplus._M_p != paVar26) {
          operator_delete(local_fc8._M_dataplus._M_p,local_fc8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1008._M_dataplus._M_p != &local_1008.field_2) {
          operator_delete(local_1008._M_dataplus._M_p,local_1008.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_fe8._M_dataplus._M_p != &local_fe8.field_2) {
          operator_delete(local_fe8._M_dataplus._M_p,
                          CONCAT71(local_fe8.field_2._M_allocated_capacity._1_7_,
                                   local_fe8.field_2._M_local_buf[0]) + 1);
        }
      }
      Path::~Path(&local_f68);
      PrimMetas::~PrimMetas((PrimMetas *)local_610);
      ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector(&local_cd8);
      ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector(&local_cf8);
      if (((string)local_1078.has_value_ == (string)0x1) &&
         (uVar32 = local_1078.contained._16_8_, uVar35 = local_1078.contained.data._0_8_,
         local_1078.contained.data.__align !=
         (anon_struct_8_0_00000001_for___align)((long)&local_1078.contained + 0x10U)))
      goto LAB_0018bab3;
      goto LAB_0018babb;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_cc0);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_cc0,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
               ,0x55);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"[USDC]",6);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_cc0,"ReconstructPrimSpecNode",0x17);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"():",3);
    poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)local_cc0,0xc03);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_cc0,"Failed to parse Prim fields under Variant.",0x2a);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"\n",1);
    ::std::__cxx11::stringbuf::str();
    PushError(local_10b8,(string *)local_e90);
    if ((undefined1 *)local_e90._0_8_ != local_e90 + 0x10) {
      operator_delete((void *)local_e90._0_8_,local_e90._16_8_ + 1);
    }
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_cc0);
    ::std::ios_base::~ios_base((ios_base *)(local_c60 + 0x10));
    PrimMetas::~PrimMetas((PrimMetas *)local_610);
    ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector(&local_cd8);
    ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector(&local_cf8);
    if (((string)local_1078.has_value_ == (string)0x1) &&
       (uVar32 = local_1078.contained._16_8_, uVar35 = local_1078.contained.data._0_8_,
       local_1078.contained.data.__align !=
       (anon_struct_8_0_00000001_for___align)((long)&local_1078.contained + 0x10U)))
    goto LAB_00189e08;
    break;
  case VariantSet:
    sVar19 = ::std::set<int,_std::less<int>,_std::allocator<int>_>::count
                       (&this->_prim_table,&local_10bc);
    if (sVar19 != 0) {
      local_e90._0_8_ = local_e90 + 0x10;
      local_e90._8_8_ = (anon_struct_8_0_00000001_for___align)0x0;
      local_e90._16_8_ = local_e90._16_8_ & 0xffffffffffffff00;
      local_e90._32_8_ = local_e68 + 8;
      local_e68._0_8_ = 0;
      local_e68[8] = '\0';
      local_e68._24_8_ = local_e40;
      local_e68._32_8_ = 0;
      local_e40[0]._M_local_buf[0] = '\0';
      local_e40[1]._0_8_ = local_e20;
      local_e40[1]._8_8_ = 0;
      local_e20[0]._M_local_buf[0] = '\0';
      local_e20[1]._0_8_ = local_e00;
      local_e20[1]._8_8_ = 0;
      local_e00[0]._M_local_buf[0] = '\0';
      local_e00[1]._0_8_ = local_de0;
      local_e00[1]._8_8_ = 0;
      local_de0[0]._M_local_buf[0] = '\0';
      local_de0[1]._M_local_buf[0] = 0;
      local_de0[1]._4_4_ = 0;
      local_de0[1]._8_1_ = 0;
      GetElemPath((optional<tinyusdz::Path> *)local_610,this,local_10c0);
      if ((bool)local_610[0] == true) {
        Path::operator=((Path *)local_e90,(Path *)(local_610 + 8));
        Path::full_path_name_abi_cxx11_((string *)local_cc0,(Path *)local_e90);
        bVar12 = tokenize_variantElement
                           ((string *)local_cc0,
                            (array<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_2UL>
                             *)0x0);
        if ((undefined1 *)CONCAT44(local_cc0._4_4_,local_cc0._0_4_) != local_cb8 + 8) {
          operator_delete((undefined1 *)CONCAT44(local_cc0._4_4_,local_cc0._0_4_),
                          local_cb8._8_8_ + 1);
        }
        if (!bVar12) {
          ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_cc0);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"[error]",7);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_cc0,
                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                     ,0x55);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"[USDC]",6);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,":",1);
          ::std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_cc0,"ReconstructPrimSpecNode",0x17);
          ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"():",3);
          poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)local_cc0,0xbd4);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
          paVar26 = &local_1048._M_elems[0].field_2;
          local_1048._M_elems[0]._M_dataplus._M_p = (pointer)paVar26;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1048._M_elems,"Invalid Variant ElementPath \'{}\'.","");
          fmt::format<tinyusdz::Path>((string *)&local_f68,local_1048._M_elems,(Path *)local_e90);
          poVar16 = ::std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)local_cc0,local_f68._prim_part._M_dataplus._M_p,
                               local_f68._prim_part._M_string_length);
          ::std::__ostream_insert<char,std::char_traits<char>>(poVar16,"\n",1);
          paVar2 = &local_f68._prim_part.field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f68._prim_part._M_dataplus._M_p != paVar2) {
            operator_delete(local_f68._prim_part._M_dataplus._M_p,
                            (ulong)(local_f68._prim_part.field_2._M_allocated_capacity + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1048._M_elems[0]._M_dataplus._M_p != paVar26) {
            operator_delete(local_1048._M_elems[0]._M_dataplus._M_p,
                            (ulong)(local_1048._M_elems[0].field_2._M_allocated_capacity + 1));
          }
          ::std::__cxx11::stringbuf::str();
          PushError(this,(string *)&local_f68);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f68._prim_part._M_dataplus._M_p != paVar2) goto LAB_0018a0f9;
          goto LAB_0018a109;
        }
        if ((bool)local_610[0] == true) {
          Path::~Path((Path *)(local_610 + 8));
        }
        local_f68._prim_part._M_dataplus._M_p = (pointer)0x0;
        local_f68._prim_part._M_string_length = 0;
        local_f68._prim_part.field_2._M_allocated_capacity = 0;
        bVar12 = ParseVariantSetFields
                           (this,fvs,(vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                                     &local_f68);
        if (bVar12) {
          bVar12 = AddVariantChildrenToPrimNode
                             (this,local_10bc,
                              (vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)
                              &local_f68);
          ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
                    ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&local_f68);
          Path::~Path((Path *)local_e90);
          if (bVar12) {
            return true;
          }
          break;
        }
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_cc0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_cc0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                   ,0x55);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"[USDC]",6);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_cc0,"ReconstructPrimSpecNode",0x17);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"():",3);
        poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)local_cc0,0xbe3);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_cc0,"Failed to parse VariantSet fields.",0x22);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"\n",1);
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)local_610);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_610._0_8_ != local_600) {
          operator_delete((void *)local_610._0_8_,local_600[0]._M_allocated_capacity + 1);
        }
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_cc0);
        ::std::ios_base::~ios_base((ios_base *)(local_c60 + 0x10));
        ::std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>::~vector
                  ((vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_> *)&local_f68);
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_cc0);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"[error]",7);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_cc0,
                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
                   ,0x55);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"[USDC]",6);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,":",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_cc0,"ReconstructPrimSpecNode",0x17);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"():",3);
        poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)local_cc0,0xbd9);
        ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
        ::std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_cc0,"(Internal errror) Element path not found.",0x29);
        ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"\n",1);
        ::std::__cxx11::stringbuf::str();
        PushError(this,(string *)&local_f68);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f68._prim_part._M_dataplus._M_p != &local_f68._prim_part.field_2) {
LAB_0018a0f9:
          operator_delete(local_f68._prim_part._M_dataplus._M_p,
                          (ulong)(local_f68._prim_part.field_2._M_allocated_capacity + 1));
        }
LAB_0018a109:
        ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_cc0);
        ::std::ios_base::~ios_base((ios_base *)(local_c60 + 0x10));
        if ((bool)local_610[0] == true) {
          Path::~Path((Path *)(local_610 + 8));
        }
      }
      pPVar34 = (Path *)local_e90;
      goto LAB_00189116;
    }
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_cc0);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"[error]",7);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_cc0,
               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usdc-reader.cc"
               ,0x55);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"[USDC]",6);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,":",1);
    ::std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_cc0,"ReconstructPrimSpecNode",0x17);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"():",3);
    poVar16 = (ostream *)::std::ostream::operator<<((ostringstream *)local_cc0,0xbc3);
    ::std::__ostream_insert<char,std::char_traits<char>>(poVar16," ",1);
    pcVar30 = "Parent Prim for this VariantSet not found.";
    lVar29 = 0x2a;
LAB_00188680:
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,pcVar30,lVar29);
    ::std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_cc0,"\n",1);
    ::std::__cxx11::stringbuf::str();
LAB_00188f6a:
    PushError(this,(string *)local_610);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_610._0_8_ != local_600) {
LAB_00188f82:
      operator_delete((void *)local_610._0_8_,local_600[0]._M_allocated_capacity + 1);
    }
LAB_00188f92:
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_cc0);
    ::std::ios_base::~ios_base((ios_base *)(local_c60 + 0x10));
    break;
  default:
    goto switchD_001888c9_default;
  }
LAB_00188fb3:
  bVar12 = false;
switchD_001888c9_default:
  return bVar12;
}

Assistant:

bool USDCReader::Impl::ReconstructPrimSpecNode(int parent, int current, int level,
                                           bool is_parent_variant,
                                           const PathIndexToSpecIndexMap &psmap,
                                           Layer *layer,
                                           nonstd::optional<PrimSpec> *primOut) {
  (void)level;
  const crate::CrateReader::Node &node = _nodes[size_t(current)];

#ifdef TINYUSDZ_LOCAL_DEBUG_PRINT
  std::cout << pprint::Indent(uint32_t(level)) << "lv[" << level
            << "] node_index[" << current << "] " << node.GetLocalPath()
            << " ==\n";
  std::cout << pprint::Indent(uint32_t(level)) << " childs = [";
  for (size_t i = 0; i < node.GetChildren().size(); i++) {
    std::cout << node.GetChildren()[i];
    if (i != (node.GetChildren().size() - 1)) {
      std::cout << ", ";
    }
  }
  std::cout << "] (is_parent_variant = " << is_parent_variant << ")\n";
#endif

  if (!psmap.count(uint32_t(current))) {
    // No specifier assigned to this node.
    DCOUT("No specifier assigned to this node: " << current);
    return true;  // would be OK.
  }

  uint32_t spec_index = psmap.at(uint32_t(current));
  if (spec_index >= _specs.size()) {
    PUSH_ERROR("Invalid specifier id: " + std::to_string(spec_index) +
               ". Must be in range [0, " + std::to_string(_specs.size()) + ")");
    return false;
  }

  const crate::Spec &spec = _specs[spec_index];

  DCOUT(pprint::Indent(uint32_t(level))
        << "  specTy = " << to_string(spec.spec_type));
  DCOUT(pprint::Indent(uint32_t(level))
        << "  fieldSetIndex = " << spec.fieldset_index.value);

  if ((spec.spec_type == SpecType::Attribute) ||
      (spec.spec_type == SpecType::Relationship)) {
    if (_prim_table.count(parent)) {
      // This node is a Properties node. These are processed in
      // ReconstructPrim(), so nothing to do here.
      return true;
    }
  }

  if (!_live_fieldsets.count(spec.fieldset_index)) {
    PUSH_ERROR("FieldSet id: " + std::to_string(spec.fieldset_index.value) +
               " must exist in live fieldsets.");
    return false;
  }

  const crate::FieldValuePairVector &fvs =
      _live_fieldsets.at(spec.fieldset_index);

  if (fvs.size() > _config.kMaxFieldValuePairs) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Too much FieldValue pairs.");
  }

#if defined(TINYUSDZ_LOCAL_DEBUG_PRINT)
  // DBG
  for (auto &fv : fvs) {
    DCOUT("parent[" << current << "] level [" << level << "] fv name "
                    << fv.first << "(type = " << fv.second.type_name() << ")");
  }
#endif

  // StageMeta = root only attributes.
  // TODO: Unify reconstrction code with USDAReder?
  if (current == 0) {
    if (const auto &pv = GetElemPath(crate::Index(uint32_t(current)))) {
      DCOUT("Root element path: " << pv.value().full_path_name());
    } else {
      PUSH_ERROR_AND_RETURN("(Internal error). Root Element Path not found.");
    }

    // Root layer(Stage) is PseudoRoot spec type.
    if (spec.spec_type != SpecType::PseudoRoot) {
      PUSH_ERROR_AND_RETURN(
          "SpecTypePseudoRoot expected for root layer(Stage) element.");
    }

    if (!ReconstrcutStageMeta(fvs, &layer->metas())) {
      PUSH_ERROR_AND_RETURN("Failed to reconstruct StageMeta.");
    }

    // TODO: Validate scene using `StageMetas::primChildren`.

    _prim_table.insert(current);

    return true;
  }

  switch (spec.spec_type) {
    case SpecType::PseudoRoot: {
      PUSH_ERROR_AND_RETURN_TAG(
          kTag, "SpecType PseudoRoot in a child node is not supported(yet)");
    }
    case SpecType::Prim: {
      nonstd::optional<std::string> typeName;
      nonstd::optional<Specifier> specifier;
      std::vector<value::token> primChildren;
      std::vector<value::token> properties;

      PrimMeta primMeta;

      DCOUT("== PrimFields begin ==> ");

      if (!ParsePrimSpec(fvs, typeName, specifier, primChildren, properties, primMeta)) {
        PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to parse Prim fields.");
        return false;
      }

      DCOUT("<== PrimFields end ===");

      Path elemPath;

      if (const auto &pv = GetElemPath(crate::Index(uint32_t(current)))) {
        DCOUT(fmt::format("Element path: {}", pv.value().full_path_name()));
        elemPath = pv.value();
      } else {
        PUSH_ERROR_AND_RETURN_TAG(kTag,
                                  "(Internal errror) Element path not found.");
      }

      // Sanity check
      if (specifier) {
        if (specifier.value() == Specifier::Def) {
          // ok
        } else if (specifier.value() == Specifier::Class) {
          // ok
        } else if (specifier.value() == Specifier::Over) {
          // ok
        } else {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "Invalid Specifier.");
        }
      } else {
        // Default = Over Prim.
        specifier = Specifier::Over;
      }

      std::string pTyName;
      if (!typeName) {
        //PUSH_WARN("Treat this node as Model(`typeName` field is missing).");
        pTyName = "Model";
      } else {
        pTyName = typeName.value();
      }

      {
        DCOUT("elemPath.prim_name = " << elemPath.prim_part());
        std::string prim_name = elemPath.prim_part();
        std::string primTypeName = typeName.has_value() ? typeName.value() : "";
        // __AnyType__
        if (typeName.has_value() && typeName.value() == "__AnyType__") {
          primTypeName = "";
        }

        // Validation check should be already done in crate-reader, so no
        // further validation required.
        if (!ValidatePrimElementName(prim_name)) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "Invalid Prim name.");
        }

        PrimSpec primspec;

#if 0
        bool is_unsupported_prim{false};
        auto prim = ReconstructPrimFromTypeName(pTyName, primTypeName, prim_name,
                                                node, specifier.value(), primChildren, properties,
                                                psmap, primMeta, &is_unsupported_prim);

        if (prim) {
          // Prim name
          prim.value().element_path() = elemPath;
        } else {
          if (_config.allow_unknown_prims && is_unsupported_prim) {
            // Try to reconsrtuct as Model
            prim = ReconstructPrimFromTypeName("Model", primTypeName, prim_name,
                                                    node, specifier.value(), primChildren, properties,
                                                    psmap, primMeta);
            if (prim) {
              // Prim name
              prim.value().element_path() = elemPath;
            } else {
              return false;
            }
          } else {
            return false;
          }
        }
#else
        primspec.typeName() = primTypeName;
        primspec.name() = prim_name;

        prim::PropertyMap props;
        if (!BuildPropertyMap(node.GetChildren(), psmap, &props)) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to build PropertyMap.");
        }
        primspec.props() = props;
        primspec.metas() = primMeta;
        // TODO: primChildren, properties

        if (primOut) {
          (*primOut) = primspec;
        }
#endif
      }

      DCOUT("add prim idx " << current);
      if (_prim_table.count(current)) {
        DCOUT("??? prim idx already set " << current);
      } else {
        _prim_table.insert(current);
      }

      break;
    }
    case SpecType::VariantSet: {
      // Assume parent(Prim) already exists(parsed)
      // TODO: Confirm Crate format allow defining Prim after VariantSet
      // serialization.
      if (!_prim_table.count(parent)) {
        PUSH_ERROR_AND_RETURN_TAG(kTag,
                                  "Parent Prim for this VariantSet not found.");
      }

      DCOUT(
          fmt::format("[{}] is a Variantset node(parent = {}). prim_idx? = {}",
                      current, parent, _prim_table.count(current)));

      Path elemPath;

      if (const auto &pv = GetElemPath(crate::Index(uint32_t(current)))) {
        elemPath = pv.value();

        DCOUT(fmt::format("Element path: {}", dump_path(elemPath)));

        // Ensure ElementPath is variant
        if (!tokenize_variantElement(elemPath.full_path_name())) {
          PUSH_ERROR_AND_RETURN_TAG(
              kTag, fmt::format("Invalid Variant ElementPath '{}'.", elemPath));
        }

      } else {
        PUSH_ERROR_AND_RETURN_TAG(kTag,
                                  "(Internal errror) Element path not found.");
      }

      std::vector<value::token> variantChildren;

      // Only contains `variantChildren` field with type `token[]`

      DCOUT("== VariantSetFields begin ==> ");

      if (!ParseVariantSetFields(fvs, variantChildren)) {
        PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to parse VariantSet fields.");
        return false;
      }

      DCOUT("<== VariantSetFields end === ");

      // Add variantChildren to prim node.
      // TODO: elemPath
      if (!AddVariantChildrenToPrimNode(parent, variantChildren)) {
        return false;
      }

      break;
    }
    case SpecType::Variant: {
      // Since the Prim this Variant node belongs to is not yet reconstructed
      // during the Prim tree traversal, We manage variant node separately

      DCOUT(fmt::format("[{}] is a Variant node(parent = {}). prim_idx? = {}",
                        current, parent, _prim_table.count(current)));

      nonstd::optional<std::string> typeName;
      nonstd::optional<Specifier> specifier;
      std::vector<value::token> primChildren;
      std::vector<value::token> properties;

      PrimMeta primMeta;

      DCOUT("== VariantFields begin ==> ");

      if (!ParsePrimSpec(fvs, typeName, specifier, primChildren, properties, primMeta)) {
        PUSH_ERROR_AND_RETURN_TAG(kTag,
                                  "Failed to parse Prim fields under Variant.");
        return false;
      }

      DCOUT("<== VariantFields end === ");

      Path elemPath;
      if (const auto &pv = GetElemPath(crate::Index(uint32_t(current)))) {
        elemPath = pv.value();
        DCOUT(fmt::format("Element path: {}", elemPath.full_path_name()));
      } else {
        PUSH_ERROR_AND_RETURN_TAG(kTag,
                                  "(Internal errror) Element path not found.");
      }

      // Sanity check
      if (specifier) {
        if (specifier.value() == Specifier::Def) {
          // ok
        } else if (specifier.value() == Specifier::Class) {
          // ok
        } else if (specifier.value() == Specifier::Over) {
          // ok
        } else {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "Invalid Specifier.");
        }
      } else {
        // Seems Variant is only composed of Properties.
        // Create pseudo `def` Prim
        // FIXME: default is `Over`?
        specifier = Specifier::Def;
      }

      std::string pTyName; // TinyUSDZ' prim typename
      if (!typeName) {
        //PUSH_WARN("Treat this node as Model(where `typeName` is missing).");
        pTyName = "Model";
      } else {
        pTyName = typeName.value();
      }

      {
        std::string prim_name = elemPath.prim_part();
        DCOUT("elemPath = " << dump_path(elemPath));
        DCOUT("prim_name = " << prim_name);

        std::string primTypeName = typeName.has_value() ? typeName.value() : "";
        // __AnyType__
        if (typeName.has_value() && typeName.value() == "__AnyType__") {
          primTypeName = "";
        }

        // Something like '{shapeVariant=Capsule}'

        std::array<std::string, 2> variantPair;
        if (!tokenize_variantElement(prim_name, &variantPair)) {
          PUSH_ERROR_AND_RETURN_TAG(
              kTag, fmt::format("Invalid Variant ElementPath '{}'.", elemPath));
        }

        std::string variantSetName = variantPair[0];
        std::string variantPrimName = variantPair[1];

        if (!ValidatePrimElementName(variantPrimName)) {
          PUSH_ERROR_AND_RETURN_TAG(
              kTag, fmt::format("Invalid Prim name in Variant: `{}`",
                                variantPrimName));
        }

#if 0
        nonstd::optional<PrimSpec> variantPrimSpec;
        bool is_unsupported_prim{false};
        variantPrim = ReconstructPrimFromTypeName(
            pTyName, primTypeName, variantPrimName, node, specifier.value(), primChildren, properties,
            psmap, primMeta, &is_unsupported_prim);

        if (variantPrim) {
          // Prim name
          variantPrim.value().element_path() =
              elemPath;  // FIXME: Use variantPrimName?

          // Prim Specifier
          variantPrim.value().specifier() = specifier.value();

          // Store variantPrim to temporary buffer.
          DCOUT(fmt::format("parent {} add prim idx {} as variant: ", parent, current));
          if (_variantPrims.count(current)) {
            DCOUT("??? prim idx already set " << current);
          } else {
            _variantPrims[current] =  variantPrim.value();
            _variantPrimChildren[parent].push_back(current);
          }
        } else {
          if (_config.allow_unknown_prims && is_unsupported_prim) {
            // Try to reconstruct as Model
            variantPrim = ReconstructPrimFromTypeName(
                "Model", primTypeName, variantPrimName, node, specifier.value(), primChildren, properties,
                psmap, primMeta);

            if (variantPrim) {
              // Prim name
              variantPrim.value().element_path() =
                  elemPath;  // FIXME: Use variantPrimName?

              // Prim Specifier
              variantPrim.value().specifier() = specifier.value();

              // Store variantPrim to temporary buffer.
              DCOUT(fmt::format("parent {} add prim idx {} as variant: ", parent, current));
              if (_variantPrims.count(current)) {
                DCOUT("??? prim idx already set " << current);
              } else {
                _variantPrims[current] = variantPrim.value();
                _variantPrimChildren[parent].push_back(current);
              }
            } else {
              return false;
            }
          } else {
            return false;
          }
        }
#else
        PrimSpec variantPrimSpec;
        variantPrimSpec.typeName() = primTypeName;
        variantPrimSpec.name() = prim_name;

        prim::PropertyMap props;
        if (!BuildPropertyMap(node.GetChildren(), psmap, &props)) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to build PropertyMap.");
        }
        variantPrimSpec.props() = props;
        variantPrimSpec.metas() = primMeta;

        // Store variantPrimSpec to temporary buffer.
        DCOUT(fmt::format("parent {} add primspec idx {} as variant: ", parent, current));
        if (_variantPrimSpecs.count(current)) {
          DCOUT("??? prim idx already set " << current);
        } else {
          _variantPrimSpecs[current] = variantPrimSpec;
          _variantPrimChildren[parent].push_back(current);
        }

#endif
      }

      break;
    }
    case SpecType::Attribute: {
      if (is_parent_variant) {
        nonstd::optional<Path> path = GetPath(spec.path_index);

        if (!path) {
          PUSH_ERROR_AND_RETURN_TAG(kTag, "Invalid PathIndex.");
        }

        Property prop;
        if (!ParseProperty(spec.spec_type, fvs, &prop)) {
          PUSH_ERROR_AND_RETURN_TAG(kTag,
                                    fmt::format("Failed to parse Attribut: {}.",
                                                path.value().prop_part()));
        }

        // Parent Prim is not yet reconstructed, so store info to temporary
        // buffer _variantAttributeNodes.
        _variantProps[current] = {path.value(), prop};
        _variantPropChildren[parent].push_back(current);

        DCOUT(
            fmt::format("parent {} current [{}] Parsed Attribute {} under Variant. PathIndex {}",
                        parent, current, path.value().prop_part(), spec.path_index));

      } else {
        // Maybe parent is Class/Over, or inherited
        PUSH_WARN(
            "TODO: SpecTypeAttribute(in conjunction with Class/Over specifier, "
            "or inherited?)");
      }
      break;
    }
    case SpecType::Connection:
    case SpecType::Relationship:
    case SpecType::RelationshipTarget: {
      PUSH_ERROR_AND_RETURN_TAG(
          kTag, fmt::format("TODO: Unsupported/Unimplemented SpecType: {}.",
                            to_string(spec.spec_type)));
      break;
    }
    case SpecType::Expression:
    case SpecType::Mapper:
    case SpecType::MapperArg: {
      PUSH_ERROR_AND_RETURN_TAG(kTag, fmt::format("Unsupported SpecType: {}.",
                                                  to_string(spec.spec_type)));
      break;
    }
    case SpecType::Unknown:
    case SpecType::Invalid: {
      PUSH_ERROR_AND_RETURN_TAG(kTag, "[InternalError] Invalid SpecType.");
      break;
    }
  }

  return true;
}